

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

int cpu_memory_rw_debug_arm
              (CPUState *cpu,target_ulong addr,void *ptr,target_ulong len,_Bool is_write)

{
  _func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *p_Var1;
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var2;
  AddressSpace *pAVar3;
  void *pvVar4;
  uint uVar5;
  hwaddr hVar6;
  hwaddr hVar8;
  uint uVar9;
  ulong uVar10;
  uc_struct_conflict7 *puVar11;
  uint uVar12;
  uint uVar13;
  undefined7 in_register_00000081;
  uint uVar14;
  uint uVar15;
  MemTxAttrs attrs;
  MemTxAttrs in_stack_ffffffffffffffa8;
  MemTxAttrs local_4c;
  void *local_48;
  undefined4 local_3c;
  uc_struct_conflict7 *local_38;
  ulong uVar7;
  
  local_3c = (undefined4)CONCAT71(in_register_00000081,is_write);
  hVar8 = len & 0xffffffff;
  uVar10 = addr & 0xffffffff;
  puVar11 = cpu->uc;
  local_38 = puVar11;
  do {
    uVar12 = (uint)hVar8;
    if (uVar12 == 0) {
      return 0;
    }
    uVar15 = (uint)uVar10;
    uVar14 = puVar11->init_target_page->mask & uVar15;
    p_Var1 = cpu->cc->get_phys_page_attrs_debug;
    local_48 = ptr;
    if (p_Var1 == (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0x0) {
      local_4c = (MemTxAttrs)0x1;
      hVar6 = (*cpu->cc->get_phys_page_debug)((CPUState_conflict *)cpu,(ulong)uVar14);
    }
    else {
      hVar6 = (*p_Var1)((CPUState_conflict *)cpu,(ulong)uVar14,&local_4c);
    }
    p_Var2 = cpu->cc->asidx_from_attrs;
    if (p_Var2 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar5 = (*p_Var2)((CPUState_conflict *)cpu,in_stack_ffffffffffffffa8);
      uVar7 = (ulong)uVar5;
      if (((int)uVar5 < 0) || (cpu->num_ases <= (int)uVar5)) {
        __assert_fail("ret < cpu->num_ases && ret >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                      ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
      }
    }
    pvVar4 = local_48;
    if (hVar6 != 0xffffffffffffffff) {
      uVar5 = puVar11->init_target_page->mask;
      uVar13 = uVar5 + uVar15;
      uVar9 = uVar14 - uVar13;
      uVar10 = (ulong)uVar9;
      if (uVar12 <= uVar9) {
        uVar10 = hVar8;
      }
      hVar8 = (~uVar5 & uVar15) + hVar6;
      if ((char)local_3c == '\0') {
        if (uVar14 != uVar13) {
          pAVar3 = cpu->cpu_ases[uVar7].as;
          flatview_read((uc_struct_conflict1 *)pAVar3->uc,pAVar3->current_map,hVar8,local_4c,
                        local_48,uVar10);
        }
      }
      else {
        address_space_write_rom_arm(cpu->cpu_ases[uVar7].as,hVar8,local_4c,local_48,uVar10);
      }
      hVar8 = (hwaddr)(uVar12 - (int)uVar10);
      local_48 = (void *)((long)pvVar4 + uVar10);
      uVar10 = (ulong)(uVar15 + (int)uVar10);
      puVar11 = local_38;
    }
    ptr = local_48;
  } while (hVar6 != 0xffffffffffffffff);
  return -1;
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}